

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O2

QDebug qt_QMetaEnum_flagDebugOperator(QDebug *debug,quint64 value,QMetaObject *meta,char *name)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  Stream *pSVar4;
  bool bVar5;
  int index;
  char *pcVar6;
  QDebug *this;
  char *in_R8;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_68;
  QMetaEnum local_50;
  QDebugStateSaver saver;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = *(int *)(*(long *)value + 0x34);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)value);
  QDebug::resetFormat((QDebug *)value);
  *(undefined2 *)(*(long *)value + 0x30) = 0x100;
  index = QMetaObject::indexOfEnumerator((QMetaObject *)name,in_R8);
  local_50 = QMetaObject::enumerator((QMetaObject *)name,index);
  if (1 < iVar2) {
    QDebug::operator<<((QDebug *)value,L"QFlags<");
    pcVar6 = QMetaEnum::scope(&local_50);
    if (pcVar6 != (char *)0x0) {
      this = QDebug::operator<<((QDebug *)value,pcVar6);
      QDebug::operator<<(this,L"::");
    }
  }
  bVar5 = QMetaEnum::isScoped(&local_50);
  if (0 < iVar2 || bVar5) {
    pcVar6 = QMetaEnum::enumName(&local_50);
    QDebug::operator<<((QDebug *)value,pcVar6);
    if (1 < iVar2) {
      QDebug::operator<<((QDebug *)value,'>');
    }
    QDebug::operator<<((QDebug *)value,'(');
  }
  QMetaEnum::valueToKeys((QByteArray *)&QStack_68,&local_50,(quint64)meta);
  QDebug::operator<<((QDebug *)value,(QByteArray *)&QStack_68);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_68);
  if (0 < iVar2 || bVar5) {
    QDebug::operator<<((QDebug *)value,')');
  }
  pSVar4 = *(Stream **)value;
  debug->stream = pSVar4;
  piVar1 = &pSVar4->ref;
  *piVar1 = *piVar1 + 1;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (QDebug)(Stream *)debug;
  }
  __stack_chk_fail();
}

Assistant:

QDebug qt_QMetaEnum_flagDebugOperator(QDebug &debug, quint64 value, const QMetaObject *meta, const char *name)
{
    const int verbosity = debug.verbosity();

    QDebugStateSaver saver(debug);
    debug.resetFormat();
    debug.noquote();
    debug.nospace();

    const QMetaEnum me = meta->enumerator(meta->indexOfEnumerator(name));

    const bool classScope = verbosity >= QDebug::DefaultVerbosity;
    if (classScope) {
        debug << u"QFlags<";

        if (const char *scope = me.scope())
            debug << scope << u"::";
    }

    const bool enumScope = me.isScoped() || verbosity > QDebug::MinimumVerbosity;
    if (enumScope) {
        debug << me.enumName();
        if (classScope)
            debug << '>';
        debug << '(';
    }

    debug << me.valueToKeys(value);

    if (enumScope)
        debug << ')';

    return debug;
}